

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O0

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,char *oid_str,size_t size)

{
  void *pvVar1;
  uchar *bound;
  uchar *out_bound;
  uchar *out_ptr;
  size_t max_possible_bytes;
  size_t bytes_per_subidentifier;
  size_t i;
  size_t num_dots;
  uchar *resized_mem;
  size_t encoded_len;
  uint local_48;
  uint component2;
  uint component1;
  uint val;
  char *str_bound;
  char *str_ptr;
  size_t sStack_28;
  int ret;
  size_t size_local;
  char *oid_str_local;
  mbedtls_asn1_buf *oid_local;
  
  str_ptr._4_4_ = 0xffffff98;
  _component1 = oid_str + size;
  component2 = 0;
  i = 0;
  for (bytes_per_subidentifier = 0; bytes_per_subidentifier < size;
      bytes_per_subidentifier = bytes_per_subidentifier + 1) {
    if (oid_str[bytes_per_subidentifier] == '.') {
      i = i + 1;
    }
  }
  if ((i == 0) || (0x7f < i)) {
    return -0x68;
  }
  max_possible_bytes = 5;
  out_ptr = (uchar *)(i * 5);
  str_bound = oid_str;
  sStack_28 = size;
  size_local = (size_t)oid_str;
  oid_str_local = (char *)oid;
  pvVar1 = calloc((size_t)out_ptr,1);
  *(void **)(oid_str_local + 0x10) = pvVar1;
  if (*(long *)(oid_str_local + 0x10) == 0) {
    return -0x6a;
  }
  out_bound = *(uchar **)(oid_str_local + 0x10);
  bound = out_ptr + *(long *)(oid_str_local + 0x10);
  str_ptr._4_4_ = oid_parse_number(&local_48,&str_bound,_component1);
  if (str_ptr._4_4_ == 0) {
    if (local_48 < 3) {
      if ((str_bound < _component1) && (*str_bound == '.')) {
        str_bound = str_bound + 1;
        str_ptr._4_4_ = oid_parse_number((uint *)((long)&encoded_len + 4),&str_bound,_component1);
        if (str_ptr._4_4_ == 0) {
          if ((local_48 < 2) && (0x27 < encoded_len._4_4_)) {
            str_ptr._4_4_ = -0x68;
          }
          else {
            if (str_bound < _component1) {
              if (*str_bound != '.') {
                str_ptr._4_4_ = -0x68;
                goto LAB_002a3b9b;
              }
              str_bound = str_bound + 1;
            }
            if (local_48 * -0x28 - 1 < encoded_len._4_4_) {
              str_ptr._4_4_ = -0x68;
            }
            else {
              str_ptr._4_4_ =
                   oid_subidentifier_encode_into
                             (&out_bound,bound,local_48 * 0x28 + encoded_len._4_4_);
              while (str_ptr._4_4_ == 0) {
                str_ptr._4_4_ = 0;
                if (_component1 <= str_bound) {
                  resized_mem = out_bound + -*(long *)(oid_str_local + 0x10);
                  num_dots = (size_t)calloc((size_t)resized_mem,1);
                  if ((void *)num_dots != (void *)0x0) {
                    memcpy((void *)num_dots,*(void **)(oid_str_local + 0x10),(size_t)resized_mem);
                    free(*(void **)(oid_str_local + 0x10));
                    *(size_t *)(oid_str_local + 0x10) = num_dots;
                    *(uchar **)(oid_str_local + 8) = resized_mem;
                    oid_str_local[0] = '\x06';
                    oid_str_local[1] = '\0';
                    oid_str_local[2] = '\0';
                    oid_str_local[3] = '\0';
                    return 0;
                  }
                  str_ptr._4_4_ = -0x6a;
                  num_dots = 0;
                  break;
                }
                str_ptr._4_4_ = oid_parse_number(&component2,&str_bound,_component1);
                if (str_ptr._4_4_ != 0) break;
                if (str_bound < _component1) {
                  if (*str_bound != '.') {
                    str_ptr._4_4_ = -0x68;
                    break;
                  }
                  str_bound = str_bound + 1;
                }
                str_ptr._4_4_ = oid_subidentifier_encode_into(&out_bound,bound,component2);
              }
            }
          }
        }
      }
      else {
        str_ptr._4_4_ = -0x68;
      }
    }
    else {
      str_ptr._4_4_ = -0x68;
    }
  }
LAB_002a3b9b:
  free(*(void **)(oid_str_local + 0x10));
  oid_str_local[0x10] = '\0';
  oid_str_local[0x11] = '\0';
  oid_str_local[0x12] = '\0';
  oid_str_local[0x13] = '\0';
  oid_str_local[0x14] = '\0';
  oid_str_local[0x15] = '\0';
  oid_str_local[0x16] = '\0';
  oid_str_local[0x17] = '\0';
  oid_str_local[8] = '\0';
  oid_str_local[9] = '\0';
  oid_str_local[10] = '\0';
  oid_str_local[0xb] = '\0';
  oid_str_local[0xc] = '\0';
  oid_str_local[0xd] = '\0';
  oid_str_local[0xe] = '\0';
  oid_str_local[0xf] = '\0';
  return str_ptr._4_4_;
}

Assistant:

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,
                                    const char *oid_str, size_t size)
{
    int ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
    const char *str_ptr = oid_str;
    const char *str_bound = oid_str + size;
    unsigned int val = 0;
    unsigned int component1, component2;
    size_t encoded_len;
    unsigned char *resized_mem;

    /* Count the number of dots to get a worst-case allocation size. */
    size_t num_dots = 0;
    for (size_t i = 0; i < size; i++) {
        if (oid_str[i] == '.') {
            num_dots++;
        }
    }
    /* Allocate maximum possible required memory:
     * There are (num_dots + 1) integer components, but the first 2 share the
     * same subidentifier, so we only need num_dots subidentifiers maximum. */
    if (num_dots == 0 || (num_dots > MBEDTLS_OID_MAX_COMPONENTS - 1)) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    /* Each byte can store 7 bits, calculate number of bytes for a
     * subidentifier:
     *
     * bytes = ceil(subidentifer_size * 8 / 7)
     */
    size_t bytes_per_subidentifier = (((sizeof(unsigned int) * 8) - 1) / 7)
                                     + 1;
    size_t max_possible_bytes = num_dots * bytes_per_subidentifier;
    oid->p = mbedtls_calloc(max_possible_bytes, 1);
    if (oid->p == NULL) {
        return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
    }
    unsigned char *out_ptr = oid->p;
    unsigned char *out_bound = oid->p + max_possible_bytes;

    ret = oid_parse_number(&component1, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if (component1 > 2) {
        /* First component can't be > 2 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr >= str_bound || *str_ptr != '.') {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    str_ptr++;

    ret = oid_parse_number(&component2, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if ((component1 < 2) && (component2 > 39)) {
        /* Root nodes 0 and 1 may have up to 40 children, numbered 0-39 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr < str_bound) {
        if (*str_ptr == '.') {
            str_ptr++;
        } else {
            ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
            goto error;
        }
    }

    if (component2 > (UINT_MAX - (component1 * 40))) {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    ret = oid_subidentifier_encode_into(&out_ptr, out_bound,
                                        (component1 * 40) + component2);
    if (ret != 0) {
        goto error;
    }

    while (str_ptr < str_bound) {
        ret = oid_parse_number(&val, &str_ptr, str_bound);
        if (ret != 0) {
            goto error;
        }
        if (str_ptr < str_bound) {
            if (*str_ptr == '.') {
                str_ptr++;
            } else {
                ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
                goto error;
            }
        }

        ret = oid_subidentifier_encode_into(&out_ptr, out_bound, val);
        if (ret != 0) {
            goto error;
        }
    }

    encoded_len = out_ptr - oid->p;
    resized_mem = mbedtls_calloc(encoded_len, 1);
    if (resized_mem == NULL) {
        ret = MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        goto error;
    }
    memcpy(resized_mem, oid->p, encoded_len);
    mbedtls_free(oid->p);
    oid->p = resized_mem;
    oid->len = encoded_len;

    oid->tag = MBEDTLS_ASN1_OID;

    return 0;

error:
    mbedtls_free(oid->p);
    oid->p = NULL;
    oid->len = 0;
    return ret;
}